

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVHandlePtr.cxx
# Opt level: O0

ssize_t __thiscall
cm::uv_async_ptr::send(uv_async_ptr *this,int __fd,void *__buf,size_t __n,int __flags)

{
  bool bVar1;
  element_type *__m;
  uv_async_s *handle;
  ssize_t extraout_RAX;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  uv_handle_deleter<uv_async_s> *deleter;
  uv_async_ptr *this_local;
  
  lock._M_device =
       (mutex_type *)
       std::get_deleter<cm::uv_handle_deleter<uv_async_s>,uv_async_s>
                 ((shared_ptr<uv_async_s> *)this);
  if ((__shared_ptr_access<std::mutex,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)lock._M_device ==
      (__shared_ptr_access<std::mutex,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x0) {
    __assert_fail("deleter",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmUVHandlePtr.cxx"
                  ,0x9d,"void cm::uv_async_ptr::send()");
  }
  __m = std::__shared_ptr_access<std::mutex,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                  ((__shared_ptr_access<std::mutex,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   lock._M_device);
  std::lock_guard<std::mutex>::lock_guard(&local_20,__m);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  if (bVar1) {
    handle = uv_handle_ptr_::operator_cast_to_uv_async_s_((uv_handle_ptr_ *)this);
    uv_async_send(handle);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return extraout_RAX;
}

Assistant:

void uv_async_ptr::send()
{
  auto deleter = std::get_deleter<uv_handle_deleter<uv_async_t>>(this->handle);
  assert(deleter);

  std::lock_guard<std::mutex> lock(*deleter->handleMutex);
  if (this->handle) {
    uv_async_send(*this);
  }
}